

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  size_t *psVar1;
  uint64_t *puVar2;
  long lVar3;
  byte bVar4;
  _7zip *zip;
  unsigned_long uVar5;
  uint64_t uVar6;
  uchar *puVar7;
  Bool BVar8;
  int iVar9;
  uint uVar10;
  uchar *puVar11;
  Bytef *__src;
  ssize_t sVar12;
  ulong uVar13;
  size_t sVar14;
  void *pvVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  char *pcVar19;
  uint uVar20;
  uchar *puVar21;
  long lVar22;
  ulong uVar23;
  uint64_t uVar24;
  uchar *puVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uchar *puVar29;
  ulong uVar30;
  ulong uVar31;
  size_t sVar32;
  size_t sVar33;
  uint8_t *outBuf;
  bool bVar34;
  bool bVar35;
  size_t sVar36;
  uint64_t local_a8;
  int local_a0;
  int local_9c;
  lzma_stream *local_98;
  CPpmd7z_RangeDec *local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  uchar *local_68;
  code *local_60;
  IByteIn *local_58;
  z_stream *local_50;
  size_t local_48;
  CPpmd7 *local_40;
  code *local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar15 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_a8);
    if (0 < (long)local_a8 && pvVar15 != (void *)0x0) {
      uVar24 = zip->folder_outbytes_remaining;
      uVar6 = zip->pack_stream_inbytes_remaining;
      if ((long)uVar6 <= (long)local_a8) {
        local_a8 = uVar6;
      }
      zip->pack_stream_inbytes_remaining = uVar6 - local_a8;
      if ((long)uVar24 <= (long)local_a8) {
        local_a8 = uVar24;
      }
      zip->folder_outbytes_remaining = uVar24 - local_a8;
      zip->uncompressed_buffer_bytes_remaining = local_a8;
      return 0;
    }
  }
  else {
    puVar21 = zip->uncompressed_buffer;
    if (puVar21 == (uchar *)0x0) {
      sVar18 = 0x10000;
      if (0x10000 < minimum) {
        sVar18 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar18;
      puVar21 = (uchar *)malloc(sVar18);
      zip->uncompressed_buffer = puVar21;
      if (puVar21 == (uchar *)0x0) {
LAB_001fa74c:
        pcVar19 = "No memory for 7-Zip decompression";
        iVar9 = 0xc;
        goto LAB_001fb1d7;
      }
LAB_001fa791:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else if (zip->uncompressed_buffer_size < minimum) {
      puVar25 = zip->uncompressed_buffer_pointer;
      uVar30 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar11 = (uchar *)realloc(puVar21,uVar30);
      if (puVar11 == (uchar *)0x0) goto LAB_001fa74c;
      lVar22 = (long)puVar25 - (long)puVar21;
      if (puVar25 == (uchar *)0x0) {
        lVar22 = 0;
      }
      zip->uncompressed_buffer = puVar11;
      zip->uncompressed_buffer_size = uVar30;
      puVar21 = puVar11;
LAB_001fa778:
      if (lVar22 != 0) {
        memmove(puVar21,puVar21 + lVar22,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    else {
      if (minimum <= zip->uncompressed_buffer_bytes_remaining) goto LAB_001fa791;
      if (zip->uncompressed_buffer_pointer != (uchar *)0x0) {
        lVar22 = (long)zip->uncompressed_buffer_pointer - (long)puVar21;
        goto LAB_001fa778;
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_48 = minimum;
    __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_a8);
    if (0 < (long)local_a8) {
      local_68 = zip->odd_bcj;
      local_58 = &zip->bytein;
      local_90 = &zip->range_dec;
      local_60 = Ppmd7z_RangeDec_Init;
      local_38 = Ppmd7_DecodeSymbol;
      local_40 = &zip->ppmd7_context;
      local_50 = &zip->stream;
      local_98 = &zip->lzstream;
      do {
        sVar33 = zip->uncompressed_buffer_size;
        sVar14 = zip->uncompressed_buffer_bytes_remaining;
        puVar21 = zip->uncompressed_buffer + sVar14;
        uVar31 = sVar33 - sVar14;
        uVar30 = zip->pack_stream_inbytes_remaining;
        uVar24 = local_a8;
        if (uVar30 <= local_a8) {
          uVar24 = uVar30;
        }
        puVar11 = (uchar *)zip->codec2;
        sVar36 = uVar31;
        puVar25 = puVar21;
        if (puVar11 != buff + 0x5eed03 || zip->codec == 0x21) {
LAB_001fa949:
          sVar33 = sVar36;
          outBuf = puVar25;
          if (puVar11 == buff + 0x5eed1b) {
            sVar14 = zip->tmp_stream_bytes_remaining;
            if (sVar14 == 0) {
LAB_001fa9d2:
              puVar25 = zip->tmp_stream_buff;
              sVar36 = zip->tmp_stream_buff_size;
              goto LAB_001fa9e8;
            }
            sVar12 = Bcj2_Decode(zip,puVar25,sVar36);
            if (-1 < sVar12) {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar14);
              sVar33 = sVar36 - sVar12;
              if ((uVar30 == 0) || (sVar33 == 0)) {
                uVar23 = uVar31 - sVar33;
                uVar10 = 0;
                if (uVar30 == 0) {
                  uVar10 = (uint)(zip->tmp_stream_bytes_remaining != 0);
                }
                goto LAB_001fac26;
              }
              outBuf = puVar25 + sVar12;
              goto LAB_001fa9d2;
            }
LAB_001fb1be:
            pcVar19 = "BCJ2 conversion Failed";
          }
          else {
LAB_001fa9e8:
            uVar5 = zip->codec;
            if ((long)uVar5 < 0x30101) {
              if (uVar5 != 0) {
                if (uVar5 != 0x21) goto LAB_001fb1c7;
                goto LAB_001faa80;
              }
              uVar23 = sVar36;
              if (uVar24 < sVar36) {
                uVar23 = uVar24;
              }
              memcpy(puVar25,__src,uVar23);
              sVar32 = uVar24 - uVar23;
              sVar36 = sVar36 - uVar23;
              uVar13 = (ulong)(uVar30 == 0);
LAB_001fabcd:
              uVar23 = uVar31 - sVar36;
              uVar10 = (uint)uVar13;
              if (zip->codec == 0x21) {
LAB_001faf73:
                puVar25 = (uchar *)zip->codec2;
              }
              else {
                puVar25 = (uchar *)zip->codec2;
                if (puVar25 == buff + 0x5eed03) {
                  if (uVar23 < 5) {
                    uVar13 = 0;
                  }
                  else {
                    puVar25 = (uchar *)zip->bcj_prevPosT;
                    uVar26 = zip->bcj_prevMask;
                    uVar28 = (ulong)uVar26;
                    puVar29 = puVar21 + (uVar23 - 4);
                    puVar11 = puVar21;
                    if (puVar21 < puVar29) {
                      local_70 = -(long)puVar21;
                      uVar20 = (uint)puVar21;
                      local_9c = uVar20 - zip->bcj_ip;
                      local_a0 = (uVar20 - zip->bcj_ip) + -1;
                      local_78 = (ulong)~uVar20;
                      puVar7 = puVar21;
                      do {
                        puVar11 = puVar7;
                        uVar26 = (uint)uVar28;
                        lVar22 = 0;
                        while ((puVar11[lVar22] & 0xfe) != 0xe8) {
                          lVar3 = lVar22 + 1;
                          lVar22 = lVar22 + 1;
                          if (puVar29 <= puVar11 + lVar3) {
                            puVar11 = puVar11 + lVar22;
                            goto LAB_001faeef;
                          }
                        }
                        lVar3 = local_70 + (long)puVar11;
                        uVar28 = 0;
                        if ((ulong)((lVar3 - (long)puVar25) + lVar22) < 4) {
                          uVar26 = uVar26 << ((char)lVar22 +
                                              (((char)~uVar20 + (char)puVar11) - (char)puVar25) &
                                             0x1fU);
                          uVar27 = uVar26 & 7;
                          if (uVar27 == 0) goto LAB_001fad17;
                          if (((0xe8U >> uVar27 & 1) == 0) &&
                             ((byte)(puVar11[lVar22 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar27))] -
                                    1) < 0xfe)) {
                            uVar28 = (ulong)uVar27;
                            goto LAB_001fad17;
                          }
LAB_001fae0a:
                          uVar28 = (ulong)((uVar26 & 3) * 2 + 1);
                          lVar17 = 1;
                        }
                        else {
LAB_001fad17:
                          bVar4 = puVar11[lVar22 + 4];
                          uVar26 = (uint)uVar28;
                          if ((bVar4 != 0xff) && (bVar4 != 0)) goto LAB_001fae0a;
                          uVar16 = ((ulong)(uint)(local_9c - (int)puVar11) +
                                   (ulong)((uint)puVar11[lVar22 + 1] |
                                          (uint)puVar11[lVar22 + 2] << 8 |
                                          (uint)puVar11[lVar22 + 3] << 0x10 | (uint)bVar4 << 0x18))
                                   - lVar22;
                          uVar27 = (uint)uVar16;
                          if (uVar26 != 0) {
                            while( true ) {
                              uVar27 = (uint)uVar16;
                              uVar26 = uVar27 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                           uVar28) * -8 + 0x18U & 0x1f);
                              if (((char)uVar26 != -1) &&
                                 (local_88 = lVar3, local_80 = uVar13, (uVar26 & 0xff) != 0)) break;
                              uVar16 = (ulong)(((local_a0 - (int)puVar11) - (int)lVar22) -
                                              (uVar27 ^ -1 << (*(char *)((long)&
                                                  x86_Convert_kMaskToBitNumber + uVar28) * -8 &
                                                  0x1fU)));
                            }
                          }
                          puVar11[lVar22 + 4] = (uchar)((int)(uVar27 << 7) >> 0x1f);
                          puVar11[lVar22 + 3] = (uchar)(uVar27 >> 0x10);
                          puVar11[lVar22 + 2] = (uchar)(uVar27 >> 8);
                          puVar11[lVar22 + 1] = (uchar)uVar27;
                          lVar17 = 5;
                        }
                        uVar26 = (uint)uVar28;
                        puVar25 = (uchar *)(lVar3 + lVar22);
                        puVar7 = puVar11 + lVar17 + lVar22;
                      } while (puVar11 + lVar17 + lVar22 < puVar29);
                      puVar25 = puVar11 + (lVar22 - (long)puVar21);
                      puVar11 = puVar11 + lVar22 + lVar17;
                    }
LAB_001faeef:
                    uVar13 = (long)puVar11 - (long)puVar21;
                    zip->bcj_prevPosT = (size_t)puVar25;
                    zip->bcj_prevMask = uVar26;
                    zip->bcj_ip = zip->bcj_ip + (int)uVar13;
                  }
                  sVar18 = uVar23 - uVar13;
                  zip->odd_bcj_size = sVar18;
                  if ((((sVar18 == 0) || (uVar10 == 1)) || (4 < sVar18)) || (uVar30 == 0)) {
                    zip->odd_bcj_size = 0;
                  }
                  else {
                    memcpy(local_68,puVar21 + uVar13,sVar18);
                    uVar23 = uVar13;
                  }
                  goto LAB_001faf73;
                }
              }
              if (puVar25 == buff + 0x5eed1b) {
                uVar30 = zip->tmp_stream_buff_size - sVar36;
                if (zip->main_stream_bytes_remaining <= uVar30) {
                  uVar30 = zip->main_stream_bytes_remaining;
                }
                zip->tmp_stream_bytes_avail = uVar30;
                zip->tmp_stream_bytes_remaining = uVar30;
                sVar12 = Bcj2_Decode(zip,outBuf,sVar33);
                if (sVar12 < 0) goto LAB_001fb1be;
                zip->main_stream_bytes_remaining =
                     zip->main_stream_bytes_remaining +
                     (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
                uVar23 = (uVar31 - sVar33) + sVar12;
              }
              if (1 < uVar10) {
                return -0x1e;
              }
              sVar32 = uVar24 - sVar32;
              goto LAB_001fb008;
            }
            if (uVar5 == 0x30101) {
LAB_001faa80:
              (zip->lzstream).next_in = __src;
              (zip->lzstream).avail_in = uVar24;
              (zip->lzstream).next_out = puVar25;
              (zip->lzstream).avail_out = sVar36;
              uVar13 = lzma_code(local_98,0);
              if ((int)uVar13 != 0) {
                if ((int)uVar13 != 1) {
                  pcVar19 = "Decompression failed(%d)";
LAB_001fb207:
                  archive_set_error(&a->archive,-1,pcVar19,uVar13 & 0xffffffff);
                  return -0x1e;
                }
                lzma_end(local_98);
                zip->lzstream_valid = 0;
              }
              sVar32 = (zip->lzstream).avail_in;
              sVar36 = (zip->lzstream).avail_out;
              goto LAB_001fabcd;
            }
            if (uVar5 == 0x30401) {
              if (((zip->ppmd7_valid == 0) || (iVar9 = zip->ppmd7_stat, iVar9 < 0)) || (sVar36 == 0)
                 ) goto LAB_001fb1c7;
              (zip->ppstream).next_in = __src;
              (zip->ppstream).avail_in = uVar24;
              (zip->ppstream).next_out = puVar25;
              (zip->ppstream).avail_out = sVar36;
              if (iVar9 != 0) {
LAB_001fab8b:
                if (uVar30 == 0) {
                  uVar23 = zip->folder_outbytes_remaining;
                }
                else {
                  uVar23 = 0;
                }
                do {
                  uVar28 = uVar23;
                  iVar9 = (*local_38)(local_40,&local_90->p);
                  if (iVar9 < 0) {
                    zip->ppmd7_stat = -1;
                    pcVar19 = "Failed to decode PPMd";
                    goto LAB_001fb128;
                  }
                  if ((zip->ppstream).overconsumed != 0) goto LAB_001fb196;
                  puVar25 = (zip->ppstream).next_out;
                  (zip->ppstream).next_out = puVar25 + 1;
                  *puVar25 = (uchar)iVar9;
                  sVar36 = (zip->ppstream).avail_out - 1;
                  (zip->ppstream).avail_out = sVar36;
                  (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
                  sVar32 = (zip->ppstream).avail_in;
                  uVar13 = 0;
                  if (sVar36 == 0) {
                    sVar36 = 0;
                    break;
                  }
                  uVar23 = uVar28 - 1;
                  if (uVar28 == 0) {
                    uVar23 = uVar13;
                  }
                } while ((sVar32 != 0) || (sVar32 = 0, 1 < uVar28));
                goto LAB_001fabcd;
              }
              (zip->bytein).a = a;
              (zip->bytein).Read = ppmd_read;
              (zip->range_dec).Stream = local_58;
              BVar8 = (*local_60)(local_90);
              if (BVar8 != 0) {
                if ((zip->ppstream).overconsumed != 0) {
LAB_001fb196:
                  zip->ppmd7_stat = -1;
                  return -0x1e;
                }
                zip->ppmd7_stat = 1;
                goto LAB_001fab8b;
              }
              zip->ppmd7_stat = -1;
              pcVar19 = "Failed to initialize PPMd range decorder";
            }
            else {
              if (uVar5 == 0x40108) {
                (zip->stream).next_in = __src;
                (zip->stream).avail_in = (uInt)uVar24;
                (zip->stream).next_out = puVar25;
                (zip->stream).avail_out = (uInt)sVar36;
                uVar13 = inflate(local_50,0);
                if (1 < (uint)uVar13) {
                  pcVar19 = "File decompression failed (%d)";
                  goto LAB_001fb207;
                }
                sVar32 = (size_t)(zip->stream).avail_in;
                sVar36 = (size_t)(zip->stream).avail_out;
                goto LAB_001fabcd;
              }
LAB_001fb1c7:
              pcVar19 = "Decompression internal error";
            }
          }
LAB_001fb1d2:
          iVar9 = -1;
          goto LAB_001fb1d7;
        }
        if (uVar31 < 5 && uVar30 != 0) {
          if (zip->odd_bcj_size == 0) goto LAB_001fa930;
          uVar24 = zip->folder_outbytes_remaining;
          bVar35 = false;
          sVar32 = 0;
          bVar34 = false;
          uVar23 = 0;
        }
        else {
          if (uVar31 != 0 && zip->odd_bcj_size != 0) {
            lVar22 = 0;
            do {
              puVar21[lVar22] = zip->odd_bcj[lVar22];
              lVar3 = lVar22 + 1;
              psVar1 = &zip->odd_bcj_size;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) break;
              bVar35 = uVar31 - 1 != lVar22;
              lVar22 = lVar3;
            } while (bVar35);
            puVar25 = puVar21 + lVar3;
            sVar36 = uVar31 - lVar3;
          }
LAB_001fa930:
          if ((uVar30 != 0) && (sVar36 != 0)) {
            puVar11 = (uchar *)zip->codec2;
            goto LAB_001fa949;
          }
          uVar10 = (uint)(uVar30 == 0);
          uVar23 = uVar31 - sVar36;
LAB_001fac26:
          sVar32 = 0;
LAB_001fb008:
          uVar24 = zip->folder_outbytes_remaining;
          if (uVar24 <= uVar23) {
            uVar23 = uVar24;
          }
          bVar34 = uVar10 != 0;
          puVar2 = &zip->pack_stream_inbytes_remaining;
          *puVar2 = *puVar2 - sVar32;
          bVar35 = *puVar2 == 0;
          sVar33 = zip->uncompressed_buffer_size;
          sVar14 = zip->uncompressed_buffer_bytes_remaining;
        }
        zip->folder_outbytes_remaining = uVar24 - uVar23;
        uVar30 = sVar14 + uVar23;
        zip->uncompressed_buffer_bytes_remaining = uVar30;
        zip->pack_stream_bytes_unconsumed = sVar32;
        if (((uVar30 == sVar33) ||
            (((uchar *)zip->codec2 == buff + 0x5eed03 &&
             (sVar33 < uVar30 + 5 && zip->odd_bcj_size != 0)))) ||
           ((bool)(bVar35 & uVar24 == uVar23))) {
          if (local_48 <= uVar30) {
            zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
            return 0;
          }
LAB_001fb13c:
          pcVar19 = "Damaged 7-Zip archive";
          goto LAB_001fb1d2;
        }
        if ((bool)(bVar34 | (uVar23 == 0 && sVar32 == 0))) goto LAB_001fb13c;
        read_consume(a);
        __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_a8);
      } while (0 < (long)local_a8);
    }
  }
  pcVar19 = "Truncated 7-Zip file body";
LAB_001fb128:
  iVar9 = 0x54;
LAB_001fb1d7:
  archive_set_error(&a->archive,iVar9,pcVar19);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}